

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O1

ValueFunctionPOMDPDiscrete *
AlphaVectorPruning::Prune
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,ValueFunctionPOMDPDiscrete *Vin,
          size_t acceleratedPruningThreshold)

{
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  ValueFunctionPOMDPDiscrete all;
  vector<double,_std::allocator<double>_> belief;
  ValueFunctionPOMDPDiscrete in;
  AlphaVector curr;
  allocator_type local_99;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  value_type_conflict3 local_68;
  ValueFunctionPOMDPDiscrete local_60;
  AlphaVector local_48;
  
  if ((Vin->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (Vin->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector(__return_storage_ptr__,Vin);
  }
  else {
    ParetoPrune(&local_60,Vin);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector(&local_98,&local_60);
    (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    if (local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pdVar1 = ((local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                 super__Vector_impl_data._M_start)->_m_values).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      pdVar2 = ((local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                 super__Vector_impl_data._M_start)->_m_values).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      local_48._m_action =
           (local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
            super__Vector_impl_data._M_start)->_m_action;
      local_48._4_4_ =
           *(undefined4 *)
            &(local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_start)->field_0x4;
      local_48._m_betaI =
           (local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
            super__Vector_impl_data._M_start)->_m_betaI;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48._m_values,
                 &(local_98.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                   super__Vector_impl_data._M_start)->_m_values);
      local_68 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_80,(ulong)((long)pdVar1 - (long)pdVar2) >> 3 & 0xffffffff,&local_68,
                 &local_99);
      bVar3 = FindBelief(&local_48,__return_storage_ptr__,&local_80,acceleratedPruningThreshold);
      if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      AlphaVector::~AlphaVector(&local_48);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(__return_storage_ptr__);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_98);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_60);
      _Unwind_Resume(bVar3);
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_98);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

ValueFunctionPOMDPDiscrete AlphaVectorPruning::Prune(const ValueFunctionPOMDPDiscrete &Vin,
                                                     size_t acceleratedPruningThreshold)
{
    if(Vin.size()==0)
        return(Vin);

    // remove alpha vectors that are dominated by a single other alpha
    // vector, can be done by checking only the corners of the belief
    // simplex
    ValueFunctionPOMDPDiscrete in = ParetoPrune(Vin);

#if DEBUG_AlphaVectorPruning
#if 0
    cout << "AlphaVectorPruning original value function: ";
    for(VFPDcit j=Vin.begin();j!=Vin.end();++j)
        cout << SoftPrintVector(j->GetValues()) << " ";
    cout << endl;
#endif
    cout << "AlphaVectorPruning after ParetoPrune (reduced from " << Vin.size()
         << " to " << in.size() << " vectors):" << endl;
    for(VFPDcit j=in.begin();j!=in.end();++j)
        cout << SoftPrintVector(j->GetValues()) << endl;
#endif

    ValueFunctionPOMDPDiscrete all(in);
    ValueFunctionPOMDPDiscrete Vpruned;

    size_t nrStates = all.at(0).GetNrValues();
		
    while(all.size()>0)
    {
        AlphaVector curr=all.at(0);
        bool foundBelief=false;
        vector<double> belief(nrStates,0);
        foundBelief = FindBelief(curr, Vpruned, belief, acceleratedPruningThreshold);
        if(foundBelief)
        {
            // we found a belief for which curr is not dominated, now
            // find the corresponding vector
            double highest=-DBL_MAX;
            for (Index i=0;i!=all.size();++i)
            {
                double value=InnerProduct(all.at(i), belief);
                if( value>highest ||
                    (Globals::EqualReward(value,highest) && LexGreater(all.at(i),curr)))
                {
                    curr = all.at(i);
                    highest = value;
                }
            }
            Vpruned.push_back(curr);
#if DEBUG_AlphaVectorPruning
            cout << "AlphaVectorPruning adding vector for belief " << SoftPrintVector(belief) << ":"
                 << SoftPrintVector(curr.GetValues())
                 << endl;
#endif
            RemoveFirstOccurrence(all,curr);
        }
        else
            RemoveFirst(all);
    }
    return(Vpruned);
}